

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O1

void __thiscall bssl::anon_unknown_0::SSLTest_Padding_Test::TestBody(SSLTest_Padding_Test *this)

{
  unsigned_short *message;
  uint16_t max_version;
  uint16_t session_version;
  internal iVar1;
  char *pcVar2;
  long lVar3;
  PaddingTest *message_00;
  pointer *__ptr;
  ScopedTrace gtest_trace_1251;
  ScopedTrace gtest_trace_1250;
  ScopedTrace gtest_trace_1259;
  size_t padded_len;
  AssertionResult gtest_ar;
  size_t base_len;
  ScopedTrace local_6b;
  ScopedTrace local_6a;
  ScopedTrace local_69;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_68;
  internal local_60 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_50;
  size_t local_48;
  long local_40;
  AssertHelper local_38;
  
  lVar3 = 0;
  do {
    message = (unsigned_short *)((long)&TestBody::kPaddingVersions[0].max_version + lVar3);
    testing::ScopedTrace::ScopedTrace<unsigned_short>
              (&local_6a,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x4e2,message);
    local_40 = lVar3;
    testing::ScopedTrace::ScopedTrace<unsigned_short>
              (&local_6b,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x4e3,(unsigned_short *)
                      ((long)&TestBody::kPaddingVersions[0].session_version + lVar3));
    max_version = *message;
    session_version = *(uint16_t *)((long)&TestBody::kPaddingVersions[0].session_version + lVar3);
    local_48 = GetClientHelloLen(max_version,session_version,1);
    local_68._M_head_impl = local_68._M_head_impl & 0xffffffff00000000;
    testing::internal::CmpHelperNE<unsigned_long,unsigned_int>
              (local_60,"base_len","0u",&local_48,(uint *)&local_68);
    if (local_60[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_68);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_68._M_head_impl + 0x10),"Baseline length could not be sampled",
                 0x24);
      if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = (local_58->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_50,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x4e8,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_50,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
      if (local_68._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_68._M_head_impl + 8))();
      }
      if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_58,local_58);
      }
LAB_00161934:
      testing::ScopedTrace::~ScopedTrace(&local_6b);
      testing::ScopedTrace::~ScopedTrace(&local_6a);
      return;
    }
    if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_58,local_58);
    }
    lVar3 = 0xb0;
    message_00 = TestBody::kPaddingTests;
    do {
      testing::ScopedTrace::ScopedTrace<unsigned_long>
                (&local_69,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x4eb,&message_00->input_len);
      testing::internal::CmpHelperLE<unsigned_long,unsigned_long>
                (local_60,"base_len","test.input_len",&local_48,&message_00->input_len);
      iVar1 = local_60[0];
      if (local_60[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_68);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_68._M_head_impl + 0x10),"Baseline ClientHello too long",0x1d);
        if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = (local_58->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_50,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x4ec,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_50,(Message *)&local_68);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
        if (local_68._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_68._M_head_impl + 8))();
        }
        if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_58,local_58);
        }
        testing::ScopedTrace::~ScopedTrace(&local_69);
        goto LAB_00161934;
      }
      if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_58,local_58);
      }
      local_68._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           GetClientHelloLen(max_version,session_version,(message_00->input_len - local_48) + 1);
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                (local_60,"padded_len","test.padded_len",(unsigned_long *)&local_68,
                 &message_00->padded_len);
      if (local_60[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_50);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_50._M_head_impl + 0x10),
                   "ClientHello was not padded to expected length",0x2d);
        pcVar2 = "";
        if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = (local_58->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_38,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x4f1,pcVar2);
        testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_50);
        testing::internal::AssertHelper::~AssertHelper(&local_38);
        if (local_50._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_50._M_head_impl + 8))();
        }
      }
      if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_58,local_58);
      }
      testing::ScopedTrace::~ScopedTrace(&local_69);
      if (iVar1 == (internal)0x0) goto LAB_00161934;
      message_00 = message_00 + 1;
      lVar3 = lVar3 + -0x10;
    } while (lVar3 != 0);
    testing::ScopedTrace::~ScopedTrace(&local_6b);
    testing::ScopedTrace::~ScopedTrace(&local_6a);
    lVar3 = local_40 + 4;
    if (lVar3 == 0xc) {
      return;
    }
  } while( true );
}

Assistant:

TEST(SSLTest, Padding) {
  struct PaddingVersions {
    uint16_t max_version, session_version;
  };
  static const PaddingVersions kPaddingVersions[] = {
      // Test the padding extension at TLS 1.2.
      {TLS1_2_VERSION, TLS1_2_VERSION},
      // Test the padding extension at TLS 1.3 with a TLS 1.2 session, so there
      // will be no PSK binder after the padding extension.
      {TLS1_3_VERSION, TLS1_2_VERSION},
      // Test the padding extension at TLS 1.3 with a TLS 1.3 session, so there
      // will be a PSK binder after the padding extension.
      {TLS1_3_VERSION, TLS1_3_VERSION},

  };

  struct PaddingTest {
    size_t input_len, padded_len;
  };
  static const PaddingTest kPaddingTests[] = {
      // ClientHellos of length below 0x100 do not require padding.
      {0xfe, 0xfe},
      {0xff, 0xff},
      // ClientHellos of length 0x100 through 0x1fb are padded up to 0x200.
      {0x100, 0x200},
      {0x123, 0x200},
      {0x1fb, 0x200},
      // ClientHellos of length 0x1fc through 0x1ff get padded beyond 0x200. The
      // padding extension takes a minimum of four bytes plus one required
      // content
      // byte. (To work around yet more server bugs, we avoid empty final
      // extensions.)
      {0x1fc, 0x201},
      {0x1fd, 0x202},
      {0x1fe, 0x203},
      {0x1ff, 0x204},
      // Finally, larger ClientHellos need no padding.
      {0x200, 0x200},
      {0x201, 0x201},
  };

  for (const PaddingVersions &versions : kPaddingVersions) {
    SCOPED_TRACE(versions.max_version);
    SCOPED_TRACE(versions.session_version);

    // Sample a baseline length.
    size_t base_len =
        GetClientHelloLen(versions.max_version, versions.session_version, 1);
    ASSERT_NE(base_len, 0u) << "Baseline length could not be sampled";

    for (const PaddingTest &test : kPaddingTests) {
      SCOPED_TRACE(test.input_len);
      ASSERT_LE(base_len, test.input_len) << "Baseline ClientHello too long";

      size_t padded_len =
          GetClientHelloLen(versions.max_version, versions.session_version,
                            1 + test.input_len - base_len);
      EXPECT_EQ(padded_len, test.padded_len)
          << "ClientHello was not padded to expected length";
    }
  }
}